

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::FinalizeNode(PeerManagerImpl *this,CNode *node)

{
  _Base_ptr *pp_Var1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  int *piVar4;
  long lVar5;
  undefined8 *puVar6;
  TxReconciliationTracker *this_00;
  AddrMan *this_01;
  NodeId peer;
  bool bVar7;
  _Self __tmp;
  _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *this_02;
  iterator __position;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  void *pvVar10;
  size_t sVar11;
  time_point tVar12;
  Logger *this_03;
  long lVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Self __tmp_1;
  _Link_type __p;
  _Link_type __x;
  _Base_ptr p_Var16;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  pVar18;
  NodeId nodeid;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock28;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = node->id;
  criticalblock27.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock27.super_unique_lock._M_owns = false;
  nodeid = lVar13;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock27.super_unique_lock);
  criticalblock28.super_unique_lock._M_device = &(this->m_peer_mutex).super_mutex;
  criticalblock28.super_unique_lock._8_8_ =
       criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock(&criticalblock28.super_unique_lock);
  p_Var9 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    __p = (_Link_type)&(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (_Base_ptr)__p;
    do {
      if (lVar13 <= *(long *)(p_Var9 + 1)) {
        p_Var8 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[*(long *)(p_Var9 + 1) < lVar13];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Link_type)p_Var8 != __p) && (*(long *)(p_Var8 + 1) <= lVar13)) {
      p_Var9 = p_Var8[1]._M_parent;
      p_Var15 = p_Var8[1]._M_left;
      p_Var8[1]._M_parent = (_Base_ptr)0x0;
      p_Var8[1]._M_left = (_Base_ptr)0x0;
      this_02 = (_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
                 *)std::_Rb_tree_rebalance_for_erase
                             ((_Rb_tree_node_base *)p_Var8,(_Rb_tree_node_base *)__p);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
      ::_M_drop_node(this_02,__p);
      psVar2 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar2 = *psVar2 - 1;
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
      if (p_Var9 != (_Base_ptr)0x0) {
        LOCK();
        (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i =
             (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i -
             (*(byte *)((long)&p_Var9[6]._M_right + 1) & 1);
        UNLOCK();
        if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i < 0) {
          __assert_fail("m_wtxid_relay_peers >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x6ef,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if (p_Var15 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15);
        }
        p_Var9 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_001d1bb4:
          __assert_fail("state != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x6f2,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = &p_Var3->_M_header;
        do {
          if (nodeid <= *(long *)(p_Var9 + 1)) {
            p_Var8 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(long *)(p_Var9 + 1) < nodeid];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 == p_Var3) || (nodeid < *(long *)(p_Var8 + 1)))
        goto LAB_001d1bb4;
        if ((char)p_Var8[3]._M_color == _S_black) {
          this->nSyncStarted = this->nSyncStarted + -1;
        }
        pp_Var1 = &p_Var8[3]._M_left;
        p_Var9 = p_Var8[3]._M_left;
        if (p_Var9 != (_Base_ptr)pp_Var1) {
          do {
            puVar6 = *(undefined8 **)p_Var9->_M_left;
            if (puVar6 == (undefined8 *)0x0) {
              __assert_fail("phashBlock != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                            ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
            }
            criticalblock28.super_unique_lock._M_device = (mutex_type *)*puVar6;
            criticalblock28.super_unique_lock._8_8_ = puVar6[1];
            pVar17 = std::
                     multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                     ::equal_range(&this->mapBlocksInFlight,(key_type *)&criticalblock28);
            __position._M_node = (_Base_ptr)pVar17.first._M_node;
            while (__position._M_node != pVar17.second._M_node._M_node) {
              if (*(long *)(__position._M_node + 2) == nodeid) {
                __position = std::
                             multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                             ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                                 *)&this->mapBlocksInFlight,__position);
              }
              else {
                __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
              }
            }
            p_Var9 = *(_Base_ptr *)p_Var9;
          } while (p_Var9 != (_Base_ptr)pp_Var1);
        }
        criticalblock28.super_unique_lock._8_8_ =
             criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
        criticalblock28.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
        std::unique_lock<std::mutex>::lock(&criticalblock28.super_unique_lock);
        peer = nodeid;
        TxOrphanage::EraseForPeer(&this->m_orphanage,nodeid);
        __x = (_Link_type)peer;
        TxRequestTracker::DisconnectedPeer(&this->m_txrequest,peer);
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
        this_00 = (this->m_txreconciliation)._M_t.
                  super___uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>
                  .super__Head_base<0UL,_TxReconciliationTracker_*,_false>._M_head_impl;
        if (this_00 != (TxReconciliationTracker *)0x0) {
          __x = (_Link_type)peer;
          TxReconciliationTracker::ForgetPeer(this_00,peer);
        }
        this->m_num_preferred_download_peers =
             this->m_num_preferred_download_peers - (uint)*(byte *)&p_Var8[4]._M_left;
        piVar4 = &this->m_peers_downloading_from;
        *piVar4 = *piVar4 - (uint)(p_Var8[3]._M_left != (_Base_ptr)pp_Var1);
        if (*piVar4 < 0) {
          __assert_fail("m_peers_downloading_from >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x70a,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        piVar4 = &this->m_outbound_peers_with_protect_from_disconnect;
        *piVar4 = *piVar4 - (uint)*(byte *)((long)&p_Var8[5]._M_parent + 1);
        if (*piVar4 < 0) {
          __assert_fail("m_outbound_peers_with_protect_from_disconnect >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x70c,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        p_Var9 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = p_Var9;
        p_Var15 = &p_Var3->_M_header;
        p_Var16 = &p_Var3->_M_header;
        if (p_Var9 != (_Base_ptr)0x0) {
LAB_001d18d5:
          lVar13 = 0x18;
          p_Var15 = p_Var16;
          if (((long)*(_Base_ptr *)(p_Var8 + 1) < peer) ||
             (lVar13 = 0x10, p_Var15 = p_Var8, peer < (long)*(_Base_ptr *)(p_Var8 + 1)))
          goto LAB_001d18ef;
          p_Var14 = p_Var8->_M_right;
          for (p_Var15 = p_Var8->_M_left; p_Var15 != (_Base_ptr)0x0;
              p_Var15 = (&p_Var15->_M_left)[(long)__x]) {
            __x = (_Link_type)(ulong)((long)*(_Base_ptr *)(p_Var15 + 1) < peer);
            if (peer <= (long)*(_Base_ptr *)(p_Var15 + 1)) {
              p_Var8 = p_Var15;
            }
          }
          for (; p_Var15 = p_Var8, p_Var14 != (_Base_ptr)0x0;
              p_Var14 = (&p_Var14->_M_left)[(long)*(_Base_ptr *)(p_Var14 + 1) <= peer]) {
            if (peer < (long)*(_Base_ptr *)(p_Var14 + 1)) {
              p_Var16 = p_Var14;
            }
          }
        }
LAB_001d1939:
        if (((this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var15)
           && (p_Var3 == (_Rb_tree_header *)p_Var16)) {
          std::
          _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
          ::_M_erase((_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                      *)p_Var9,__x);
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var3->_M_header;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var3->_M_header;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        }
        else {
          if (p_Var15 == p_Var16) {
            sVar11 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
          else {
            do {
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
              pvVar10 = (void *)std::_Rb_tree_rebalance_for_erase
                                          ((_Rb_tree_node_base *)p_Var15,
                                           (_Rb_tree_node_base *)p_Var3);
              std::__cxx11::
              _List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
              ::~_List_base((_List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                             *)((long)pvVar10 + 0x70));
              operator_delete(pvVar10,0xc0);
              sVar11 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
              (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar11;
              p_Var15 = p_Var9;
            } while (p_Var9 != p_Var16);
          }
          if (sVar11 != 0) goto LAB_001d1a4d;
        }
        if ((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          __assert_fail("mapBlocksInFlight.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x712,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if (this->m_num_preferred_download_peers != 0) {
          __assert_fail("m_num_preferred_download_peers == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x713,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if (this->m_peers_downloading_from != 0) {
          __assert_fail("m_peers_downloading_from == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x714,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if (this->m_outbound_peers_with_protect_from_disconnect != 0) {
          __assert_fail("m_outbound_peers_with_protect_from_disconnect == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x715,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i != 0) {
          __assert_fail("m_wtxid_relay_peers == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x716,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        criticalblock28.super_unique_lock._8_8_ =
             criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
        criticalblock28.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
        std::unique_lock<std::mutex>::lock(&criticalblock28.super_unique_lock);
        sVar11 = TxRequestTracker::Size(&this->m_txrequest);
        if (sVar11 != 0) {
          __assert_fail("m_txrequest.Size() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x718,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        if ((this->m_orphanage).m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          __assert_fail("m_orphanage.Size() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                        ,0x719,
                        "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                       );
        }
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
LAB_001d1a4d:
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
        if ((((node->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
           ((node->m_conn_type & ~BLOCK_RELAY) != INBOUND)) {
          this_01 = this->m_addrman;
          tVar12 = NodeClock::now();
          AddrMan::Connected(this_01,&(node->addr).super_CService,
                             (NodeSeconds)((long)tVar12.__d.__r / 1000000000));
        }
        criticalblock28.super_unique_lock._M_device = &(this->m_headers_presync_mutex).super_mutex;
        criticalblock28.super_unique_lock._8_8_ =
             criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock(&criticalblock28.super_unique_lock);
        pVar18 = std::
                 _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
                 ::equal_range(&(this->m_headers_presync_stats)._M_t,&nodeid);
        std::
        _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
        ::_M_erase_aux(&(this->m_headers_presync_stats)._M_t,(_Base_ptr)pVar18.first._M_node,
                       (_Base_ptr)pVar18.second._M_node);
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
        this_03 = LogInstance();
        bVar7 = BCLog::Logger::WillLogCategoryLevel(this_03,NET,Debug);
        if (bVar7) {
          logging_function._M_str = "FinalizeNode";
          logging_function._M_len = 0xc;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file._M_len = 0x5b;
          LogPrintf_<long>(logging_function,source_file,0x727,NET,Debug,
                           "Cleared nodestate for peer=%d\n",&nodeid);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
          __stack_chk_fail();
        }
        return;
      }
      goto LAB_001d1b95;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
LAB_001d1b95:
  __assert_fail("peer != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                ,0x6ed,
                "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)");
LAB_001d18ef:
  p_Var8 = *(_Base_ptr *)
            (&((_Rb_tree_impl<std::less<long>,_true> *)&p_Var8->_M_color)->field_0x0 + lVar13);
  p_Var16 = p_Var15;
  if (p_Var8 == (_Base_ptr)0x0) goto LAB_001d1939;
  goto LAB_001d18d5;
}

Assistant:

void PeerManagerImpl::FinalizeNode(const CNode& node)
{
    NodeId nodeid = node.GetId();
    {
    LOCK(cs_main);
    {
        // We remove the PeerRef from g_peer_map here, but we don't always
        // destruct the Peer. Sometimes another thread is still holding a
        // PeerRef, so the refcount is >= 1. Be careful not to do any
        // processing here that assumes Peer won't be changed before it's
        // destructed.
        PeerRef peer = RemovePeer(nodeid);
        assert(peer != nullptr);
        m_wtxid_relay_peers -= peer->m_wtxid_relay;
        assert(m_wtxid_relay_peers >= 0);
    }
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (state->fSyncStarted)
        nSyncStarted--;

    for (const QueuedBlock& entry : state->vBlocksInFlight) {
        auto range = mapBlocksInFlight.equal_range(entry.pindex->GetBlockHash());
        while (range.first != range.second) {
            auto [node_id, list_it] = range.first->second;
            if (node_id != nodeid) {
                range.first++;
            } else {
                range.first = mapBlocksInFlight.erase(range.first);
            }
        }
    }
    {
        LOCK(m_tx_download_mutex);
        m_orphanage.EraseForPeer(nodeid);
        m_txrequest.DisconnectedPeer(nodeid);
    }
    if (m_txreconciliation) m_txreconciliation->ForgetPeer(nodeid);
    m_num_preferred_download_peers -= state->fPreferredDownload;
    m_peers_downloading_from -= (!state->vBlocksInFlight.empty());
    assert(m_peers_downloading_from >= 0);
    m_outbound_peers_with_protect_from_disconnect -= state->m_chain_sync.m_protect;
    assert(m_outbound_peers_with_protect_from_disconnect >= 0);

    m_node_states.erase(nodeid);

    if (m_node_states.empty()) {
        // Do a consistency check after the last peer is removed.
        assert(mapBlocksInFlight.empty());
        assert(m_num_preferred_download_peers == 0);
        assert(m_peers_downloading_from == 0);
        assert(m_outbound_peers_with_protect_from_disconnect == 0);
        assert(m_wtxid_relay_peers == 0);
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Size() == 0);
        assert(m_orphanage.Size() == 0);
    }
    } // cs_main
    if (node.fSuccessfullyConnected &&
        !node.IsBlockOnlyConn() && !node.IsInboundConn()) {
        // Only change visible addrman state for full outbound peers.  We don't
        // call Connected() for feeler connections since they don't have
        // fSuccessfullyConnected set.
        m_addrman.Connected(node.addr);
    }
    {
        LOCK(m_headers_presync_mutex);
        m_headers_presync_stats.erase(nodeid);
    }
    LogDebug(BCLog::NET, "Cleared nodestate for peer=%d\n", nodeid);
}